

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xgemm.c
# Opt level: O1

void xb_sgemm(char *transa,char *transb,int *M,int *N,int *K,float *alpha,float *a,int *p_lda,
             float *b,int *p_ldb,float *beta,float *c,int *p_ldc)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  float *pfVar11;
  ulong uVar12;
  float *pfVar13;
  float *pfVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  long local_40;
  
  uVar4 = *M;
  uVar2 = *N;
  uVar3 = *K;
  if ((int)uVar4 <= *p_ldc && (0 < (int)uVar3 && (0 < (int)uVar2 && 0 < (int)uVar4))) {
    fVar16 = *alpha;
    fVar1 = *beta;
    uVar12 = (ulong)uVar4;
    iVar8 = *p_lda;
    iVar7 = *p_ldb;
    uVar5 = uVar3;
    if ((byte)(*transa | 0x20U) == 0x6e) {
      uVar5 = uVar4;
    }
    if ((int)uVar5 <= iVar8) {
      uVar5 = uVar2;
      if ((byte)(*transb | 0x20U) == 0x6e) {
        uVar5 = uVar3;
      }
      if (((int)uVar5 <= iVar7) &&
         ((((fVar16 != 0.0 || (NAN(fVar16))) || (fVar1 != 1.0)) || (NAN(fVar1))))) {
        lVar10 = 1;
        if ((byte)(*transa | 0x20U) == 0x6e) {
          local_40 = 1;
        }
        else {
          local_40 = (long)iVar8;
          iVar8 = 1;
        }
        if ((byte)(*transb | 0x20U) != 0x6e) {
          lVar10 = (long)iVar7;
          iVar7 = 1;
        }
        lVar9 = (long)*p_ldc;
        if ((fVar16 != 0.0) || (NAN(fVar16))) {
          if ((fVar16 != 1.0) || (NAN(fVar16))) {
            if (0 < (int)uVar4) {
              uVar6 = 0;
              do {
                if (0 < (int)uVar2) {
                  uVar4 = 0;
                  pfVar11 = b;
                  uVar15 = uVar6;
                  do {
                    fVar17 = 0.0;
                    pfVar13 = pfVar11;
                    pfVar14 = a;
                    uVar5 = uVar3;
                    if (0 < (int)uVar3) {
                      do {
                        fVar17 = fVar17 + *pfVar14 * *pfVar13;
                        uVar5 = uVar5 - 1;
                        pfVar13 = pfVar13 + lVar10;
                        pfVar14 = pfVar14 + iVar8;
                      } while (uVar5 != 0);
                    }
                    c[uVar15] = c[uVar15] * fVar1 + fVar17 * fVar16;
                    uVar4 = uVar4 + 1;
                    uVar15 = uVar15 + lVar9;
                    pfVar11 = pfVar11 + iVar7;
                  } while (uVar4 != uVar2);
                }
                uVar6 = uVar6 + 1;
                a = a + local_40;
              } while (uVar6 != uVar12);
            }
          }
          else if ((fVar1 != 0.0) || (NAN(fVar1))) {
            if (0 < (int)uVar4) {
              uVar6 = 0;
              do {
                if (0 < (int)uVar2) {
                  uVar4 = 0;
                  pfVar11 = b;
                  uVar15 = uVar6;
                  do {
                    fVar16 = 0.0;
                    pfVar13 = pfVar11;
                    pfVar14 = a;
                    uVar5 = uVar3;
                    if (0 < (int)uVar3) {
                      do {
                        fVar16 = fVar16 + *pfVar14 * *pfVar13;
                        uVar5 = uVar5 - 1;
                        pfVar13 = pfVar13 + lVar10;
                        pfVar14 = pfVar14 + iVar8;
                      } while (uVar5 != 0);
                    }
                    c[uVar15] = c[uVar15] * fVar1 + fVar16;
                    uVar4 = uVar4 + 1;
                    uVar15 = uVar15 + lVar9;
                    pfVar11 = pfVar11 + iVar7;
                  } while (uVar4 != uVar2);
                }
                uVar6 = uVar6 + 1;
                a = a + local_40;
              } while (uVar6 != uVar12);
            }
          }
          else if (0 < (int)uVar4) {
            uVar6 = 0;
            do {
              if (0 < (int)uVar2) {
                uVar4 = 0;
                pfVar11 = b;
                uVar15 = uVar6;
                do {
                  fVar16 = 0.0;
                  pfVar13 = a;
                  pfVar14 = pfVar11;
                  uVar5 = uVar3;
                  if (0 < (int)uVar3) {
                    do {
                      fVar16 = fVar16 + *pfVar13 * *pfVar14;
                      uVar5 = uVar5 - 1;
                      pfVar13 = pfVar13 + iVar8;
                      pfVar14 = pfVar14 + lVar10;
                    } while (uVar5 != 0);
                  }
                  c[uVar15] = fVar16;
                  uVar4 = uVar4 + 1;
                  uVar15 = uVar15 + lVar9;
                  pfVar11 = pfVar11 + iVar7;
                } while (uVar4 != uVar2);
              }
              uVar6 = uVar6 + 1;
              a = a + local_40;
            } while (uVar6 != uVar12);
          }
        }
        else if (0 < (int)uVar4) {
          uVar6 = 0;
          do {
            pfVar11 = c;
            uVar4 = uVar2;
            if (0 < (int)uVar2) {
              do {
                *pfVar11 = *pfVar11 * fVar1;
                uVar4 = uVar4 - 1;
                pfVar11 = pfVar11 + lVar9;
              } while (uVar4 != 0);
            }
            uVar6 = uVar6 + 1;
            c = c + 1;
          } while (uVar6 != uVar12);
        }
      }
    }
  }
  return;
}

Assistant:

void
xb_sgemm (char *transa, char *transb, int *M, int *N, int *K,
	  float *alpha, const float *a, int *p_lda, const float *b, 
	  int *p_ldb, float *beta, float *c, int *p_ldc)
/* 
 * Purpose
 * =======
 *
 * This routine computes the matrix product:
 *
 *      C   <-  alpha * op(A) * op(B)  +  beta * C .
 * 
 * where op(M) represents either M, M transpose, 
 * or M conjugate transpose.
 *
 * Arguments
 * =========
 *
 * order   (input) enum blas_order_type
 *         Storage  of input matrices A, B, and C.
 *
 * transa  (input) enum blas_trans_type
 *         Operation to be done on matrix A before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 *
 * transb  (input) enum blas_trans_type
 *         Operation to be done on matrix B before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 * 
 * m n k   (input) int
 *         The dimensions of matrices A, B, and C.
 *         Matrix C is m-by-n matrix.
 *         Matrix A is m-by-k if A is not transposed, 
 *                     k-by-m otherwise.
 *         Matrix B is k-by-n if B is not transposed, 
 *                     n-by-k otherwise.
 *      
 * alpha   (input) float
 *
 * a       (input) const float*
 *         matrix A.
 * 
 * lda     (input) int
 *         leading dimension of A.
 * 
 * b       (input) const float*
 *         matrix B
 *
 * ldb     (input) int
 *         leading dimension of B.
 *
 * beta    (input) float
 *
 * c       (input/output) float*
 *         matrix C
 *
 * ldc     (input) int
 *         leading dimension of C.
 *
 */
{


    /* Integer Index Variables */
    int i, j, h;

    int ai, bj, ci;
    int aih, bhj, cij;		/* Index into matrices a, b, c during multiply */

    int incai, incaih;		/* Index increments for matrix a */
    int incbj, incbhj;		/* Index increments for matrix b */
    int incci, inccij;		/* Index increments for matrix c */

    /* Input Matrices */
    const float *a_i = a;
    const float *b_i = b;

    /* Output Matrix */
    float *c_i = c;

    /* Input Scalars */
    float alpha_i = *alpha;
    float beta_i = *beta;
    int m=*M, n=*N, k=*K;
    int lda=*p_lda, ldb=*p_ldb, ldc=*p_ldc;

    /* Temporary Floating-Point Variables */
    float a_elem;
    float b_elem;
    float c_elem;
    float prod;
    float sum;
    float tmp1;
    float tmp2;

    char order = COLMAJOR; /* For the time being, it is always COLMAJOR.
			      Eventually, it might change. */

#if MDEBUG
    const float *A = a, *B =b, *C = c, *C1 = c;
    printf("In Sgemm\n");
    printf("m=%d, n=%d, k=%d\n", m, n, k);
    printf("alpha=%f, beta=%f\n", alpha_i, beta_i);
    printf("\n");	  
    /* for(i=0; i<m*k; i++)  printf("%.1f ", *A++); printf("\n\n"); */
    /* for(i=0; i<n*k; i++)  printf("%.1f ", *B++); printf("\n\n"); */
    /* for(i=0; i<n*k; i++)  printf("%.1f ", *C++); printf("\n"); */
#endif
    
    /* Test for error conditions */
    if (m <= 0 || n <= 0 || k <= 0)
    {
	return;
    }

    if (order == COLMAJOR)
    {

	if (ldc < m)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < m)
		return;
	}
	else
	{
	    if (lda < k)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < k)
		return;
	}
	else
	{
	    if (ldb < n)
		return;
	}

    }
    else
    {
	/* row major */
	if (ldc < n)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < k)
		return;
	}
	else
	{
	    if (lda < m)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < n)
		return;
	}
	else
	{
	    if (ldb < k)
		return;
	}
    }

    /* Test for no-op */
    if (alpha_i == 0.0 && beta_i == 1.0)
    {
	return;
    }

    /* Set Index Parameters */
    if (order == COLMAJOR)
    {
	incci = 1;
	inccij = ldc;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = 1;
	    incaih = lda;
	}
	else
	{
	    incai = lda;
	    incaih = 1;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = ldb;
	    incbhj = 1;
	}
	else
	{
	    incbj = 1;
	    incbhj = ldb;
	}

    }
    else
    {
	/* row major */
	incci = ldc;
	inccij = 1;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = lda;
	    incaih = 1;
	}
	else
	{
	    incai = 1;
	    incaih = lda;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = 1;
	    incbhj = ldb;
	}
	else
	{
	    incbj = ldb;
	    incbhj = 1;
	}

    }



    /* Ajustment to increments */







    /* alpha = 0.  In this case, just return beta * C */
    if (alpha_i == 0.0)
    {

	ci = 0;
	for (i = 0; i < m; i++, ci += incci)
	{
	    cij = ci;
	    for (j = 0; j < n; j++, cij += inccij)
	    {
		c_elem = c_i[cij];
		tmp1 = c_elem * beta_i;
		c_i[cij] = tmp1;
	    }
	}

    }
    else if (alpha_i == 1.0)
    {

	/* Case alpha == 1. */

	if (beta_i == 0.0)
	{
	    /* Case alpha == 1, beta == 0.   We compute  C <--- A * B */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem = a_i[aih];
			b_elem = b_i[bhj];
			prod = a_elem * b_elem;
			sum = sum + prod;
		    }
		    tmp1 = sum;
		    c_i[cij] = tmp1;
		}
	    }

	}
	else
	{
	    /* Case alpha == 1, but beta != 0.
	       We compute   C <--- A * B + beta * C   */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem = a_i[aih];
			b_elem = b_i[bhj];
			prod = a_elem * b_elem;
			sum = sum + prod;
		    }

		    c_elem = c_i[cij];
		    tmp2 = c_elem * beta_i;
		    tmp1 = sum;
		    tmp1 = tmp2 + tmp1;
		    c_i[cij] = tmp1;
		}
	    }
	}

    }
    else
    {

	/* The most general form,   C <-- alpha * A * B + beta * C  */
	ci = 0;
	ai = 0;
	for (i = 0; i < m; i++, ci += incci, ai += incai)
	{

	    cij = ci;
	    bj = 0;

	    for (j = 0; j < n; j++, cij += inccij, bj += incbj)
	    {

		aih = ai;
		bhj = bj;

		sum = 0.0;

		for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		{
		    a_elem = a_i[aih];
		    b_elem = b_i[bhj];
		    prod = a_elem * b_elem;
		    sum = sum + prod;
		}

		tmp1 = sum * alpha_i;
		c_elem = c_i[cij];
		tmp2 = c_elem * beta_i;
		tmp1 = tmp1 + tmp2;
		c_i[cij] = tmp1;
	    }
	}

    }

#if MDEBUG
    printf("m=%d, n=%d, k=%d\n", m, n, k);
    printf("lda=%d, ldb=%d, ldc=%d\n", lda, ldb, ldc);
    printf("\n");	  
    for(i=0; i<n*k; i++)  printf("%.1f ", *C1++); printf("\n");
#endif

}